

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ForeverStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForeverStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::StatementSyntax&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,
          StatementSyntax *args_3)

{
  Token foreverKeyword;
  ForeverStatementSyntax *pFVar1;
  ForeverStatementSyntax *in_RCX;
  undefined8 in_RDX;
  Info *in_RSI;
  NamedLabelSyntax *in_R8;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pFVar1 = (ForeverStatementSyntax *)
           allocate((BumpAllocator *)in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  foreverKeyword.info = in_RSI;
  foreverKeyword.kind = (short)in_RDX;
  foreverKeyword._2_1_ = (char)((ulong)in_RDX >> 0x10);
  foreverKeyword.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  foreverKeyword.rawLen = (int)((ulong)in_RDX >> 0x20);
  slang::syntax::ForeverStatementSyntax::ForeverStatementSyntax
            (in_RCX,in_R8,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
             (in_RCX->super_StatementSyntax).super_SyntaxNode.parent,foreverKeyword,
             *(StatementSyntax **)&(in_RCX->super_StatementSyntax).super_SyntaxNode);
  return pFVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }